

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O3

void loguru::print_preamble
               (char *out_buff,size_t out_buff_size,Verbosity verbosity,char *file,uint line)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  char *pcVar6;
  char *pcVar7;
  undefined4 in_register_00000014;
  ulong uVar8;
  char *pcVar9;
  char level_buff [6];
  tm time_info;
  time_t sec_since_epoch;
  char thread_name [17];
  char shortened_filename [24];
  char local_b6 [6];
  double local_b0;
  tm local_a8;
  long local_70;
  char local_68 [32];
  char local_48 [24];
  
  *out_buff = '\0';
  if (g_preamble != '\x01') {
    return;
  }
  lVar4 = std::chrono::_V2::system_clock::now();
  local_70 = lVar4 / 1000000000;
  localtime_r(&local_70,&local_a8);
  lVar5 = std::chrono::_V2::steady_clock::now();
  local_b0 = (double)((lVar5 - s_start_time) / 1000000);
  local_68[0] = '\0';
  local_68[1] = '\0';
  local_68[2] = '\0';
  local_68[3] = '\0';
  local_68[4] = '\0';
  local_68[5] = '\0';
  local_68[6] = '\0';
  local_68[7] = '\0';
  local_68[8] = '\0';
  local_68[9] = '\0';
  local_68[10] = '\0';
  local_68[0xb] = '\0';
  local_68[0xc] = '\0';
  local_68[0xd] = '\0';
  local_68[0xe] = '\0';
  local_68[0xf] = '\0';
  local_68[0x10] = 0;
  get_thread_name(local_68,0x11,true);
  pcVar6 = (char *)CONCAT44(in_register_00000014,verbosity);
  pcVar7 = (char *)CONCAT44(in_register_00000014,verbosity);
  do {
    do {
      pcVar9 = pcVar6;
      pcVar6 = pcVar7 + 1;
      cVar1 = *pcVar7;
      pcVar7 = pcVar6;
    } while (cVar1 == '/');
  } while ((cVar1 == '\\') || (pcVar6 = pcVar9, cVar1 != '\0'));
  if ((s_verbosity_to_name_callback == (code *)0x0) ||
     (pcVar7 = (char *)(*s_verbosity_to_name_callback)(out_buff_size & 0xffffffff),
     pcVar7 == (char *)0x0)) {
    if ((int)out_buff_size < -2) {
      pcVar7 = "FATL";
    }
    else {
      uVar2 = (int)out_buff_size + 2;
      if (2 < uVar2) {
        snprintf(local_b6,5,"% 4d",out_buff_size & 0xffffffff);
        goto LAB_0013a062;
      }
      pcVar7 = (&PTR_anon_var_dwarf_131cd1_00169aa0)[uVar2];
    }
  }
  snprintf(local_b6,5,"%s",pcVar7);
LAB_0013a062:
  if (g_preamble_date == '\x01') {
    iVar3 = snprintf(out_buff,0x5c,"%04d-%02d-%02d ",(ulong)(local_a8.tm_year + 0x76c),
                     (ulong)(local_a8.tm_mon + 1),(ulong)(uint)local_a8.tm_mday);
    uVar8 = (ulong)iVar3;
  }
  else {
    uVar8 = 0;
  }
  if ((uVar8 < 0x5c) && (g_preamble_time != '\0')) {
    iVar3 = snprintf(out_buff + uVar8,0x5c - uVar8,"%02d:%02d:%02d.%03lld ",
                     (ulong)(uint)local_a8.tm_hour,(ulong)(uint)local_a8.tm_min,
                     (ulong)(uint)local_a8.tm_sec,(lVar4 / 1000000) % 1000);
    uVar8 = uVar8 + (long)iVar3;
  }
  if ((g_preamble_uptime == '\x01') && (uVar8 < 0x5c)) {
    iVar3 = snprintf(out_buff + uVar8,0x5c - uVar8,"(%8.3fs) ",local_b0 / 1000.0);
    uVar8 = uVar8 + (long)iVar3;
  }
  if ((g_preamble_thread == '\x01') && (uVar8 < 0x5c)) {
    iVar3 = snprintf(out_buff + uVar8,0x5c - uVar8,"[%-*s]",0x10,local_68);
    uVar8 = uVar8 + (long)iVar3;
  }
  if ((g_preamble_file == '\x01') && (uVar8 < 0x5c)) {
    snprintf(local_48,0x18,"%s",pcVar9);
    iVar3 = snprintf(out_buff + uVar8,0x5c - uVar8,"%*s:%-5u ",0x17,local_48,
                     (ulong)file & 0xffffffff);
    uVar8 = uVar8 + (long)iVar3;
  }
  if ((g_preamble_verbose == '\x01') && (uVar8 < 0x5c)) {
    iVar3 = snprintf(out_buff + uVar8,0x5c - uVar8,"%4s",local_b6);
    uVar8 = uVar8 + (long)iVar3;
  }
  if ((g_preamble_pipe == '\x01') && (uVar8 < 0x5c)) {
    snprintf(out_buff + uVar8,0x5c - uVar8,"| ");
  }
  return;
}

Assistant:

static void print_preamble(char* out_buff, size_t out_buff_size, Verbosity verbosity, const char* file, unsigned line)
	{
		if (out_buff_size == 0) { return; }
		out_buff[0] = '\0';
		if (!g_preamble) { return; }
		long long ms_since_epoch = duration_cast<milliseconds>(system_clock::now().time_since_epoch()).count();
		time_t sec_since_epoch = time_t(ms_since_epoch / 1000);
		tm time_info;
		localtime_r(&sec_since_epoch, &time_info);

		auto uptime_ms = duration_cast<milliseconds>(steady_clock::now() - s_start_time).count();
		auto uptime_sec = uptime_ms / 1000.0;

		char thread_name[LOGURU_THREADNAME_WIDTH + 1] = {0};
		get_thread_name(thread_name, LOGURU_THREADNAME_WIDTH + 1, true);

		if (s_strip_file_path) {
			file = filename(file);
		}

		char level_buff[6];
		const char* custom_level_name = get_verbosity_name(verbosity);
		if (custom_level_name) {
			snprintf(level_buff, sizeof(level_buff) - 1, "%s", custom_level_name);
		} else {
			snprintf(level_buff, sizeof(level_buff) - 1, "% 4d", verbosity);
		}

		long pos = 0;

		if (g_preamble_date && pos < out_buff_size) {
			pos += snprintf(out_buff + pos, out_buff_size - pos, "%04d-%02d-%02d ",
				             1900 + time_info.tm_year, 1 + time_info.tm_mon, time_info.tm_mday);
		}
		if (g_preamble_time && pos < out_buff_size) {
			pos += snprintf(out_buff + pos, out_buff_size - pos, "%02d:%02d:%02d.%03lld ",
			               time_info.tm_hour, time_info.tm_min, time_info.tm_sec, ms_since_epoch % 1000);
		}
		if (g_preamble_uptime && pos < out_buff_size) {
			pos += snprintf(out_buff + pos, out_buff_size - pos, "(%8.3fs) ",
			               uptime_sec);
		}
		if (g_preamble_thread && pos < out_buff_size) {
			pos += snprintf(out_buff + pos, out_buff_size - pos, "[%-*s]",
			               LOGURU_THREADNAME_WIDTH, thread_name);
		}
		if (g_preamble_file && pos < out_buff_size) {
			char shortened_filename[LOGURU_FILENAME_WIDTH + 1];
			snprintf(shortened_filename, LOGURU_FILENAME_WIDTH + 1, "%s", file);
			pos += snprintf(out_buff + pos, out_buff_size - pos, "%*s:%-5u ",
			               LOGURU_FILENAME_WIDTH, shortened_filename, line);
		}
		if (g_preamble_verbose && pos < out_buff_size) {
			pos += snprintf(out_buff + pos, out_buff_size - pos, "%4s",
			               level_buff);
		}
		if (g_preamble_pipe && pos < out_buff_size) {
			pos += snprintf(out_buff + pos, out_buff_size - pos, "| ");
		}
	}